

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUCachePolicy.cpp
# Opt level: O2

void __thiscall GmmLib::GmmGen12dGPUCachePolicy::SetUpMOCSTable(GmmGen12dGPUCachePolicy *this)

{
  PRODUCT_FAMILY PVar1;
  Context *pCVar2;
  undefined8 uVar3;
  int index;
  long lVar4;
  
  pCVar2 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
           pGmmLibContext;
  *(undefined8 *)
   &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
    super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex = 0;
  PVar1 = (pCVar2->pPlatformInfo->Data).Platform.eProductFamily;
  if (PVar1 == IGFX_DG1) {
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      *(undefined1 *)&pCVar2->CachePolicyTbl[lVar4].L3 = 0x30;
      pCVar2->CachePolicyTbl[lVar4].LeCC.DwordValue =
           (pCVar2->CachePolicyTbl[lVar4].LeCC.DwordValue & 0xfff80000) + 1;
      pCVar2->CachePolicyTbl[lVar4].HDCL1 = '\0';
    }
    *(undefined1 *)&pCVar2->CachePolicyTbl[0].L3 = 0x10;
    pCVar2->CachePolicyTbl[0].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[1].L3 = 0x10;
    pCVar2->CachePolicyTbl[1].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[1].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[1].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[2].L3 = 0;
    pCVar2->CachePolicyTbl[2].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[2].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[2].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[3].L3 = 0;
    pCVar2->CachePolicyTbl[3].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[3].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[3].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[4].L3 = 0;
    pCVar2->CachePolicyTbl[4].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[4].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[4].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[5].L3 = 0x30;
    pCVar2->CachePolicyTbl[5].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[5].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[5].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[6].L3 = 0x33;
    pCVar2->CachePolicyTbl[6].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[6].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[6].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[7].L3 = 0x37;
    pCVar2->CachePolicyTbl[7].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[7].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[7].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[8].L3 = 0x3f;
    pCVar2->CachePolicyTbl[8].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[8].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[8].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[0x30].L3 = 0x30;
    pCVar2->CachePolicyTbl[0x30].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0x30].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0x30].HDCL1 = '\x01';
    *(undefined1 *)&pCVar2->CachePolicyTbl[0x31].L3 = 0x10;
    pCVar2->CachePolicyTbl[0x31].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0x31].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0x31].HDCL1 = '\x01';
    *(undefined1 *)&pCVar2->CachePolicyTbl[0x3c].L3 = 0x10;
    pCVar2->CachePolicyTbl[0x3c].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0x3c].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0x3c].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[0x3d].L3 = 0x10;
    pCVar2->CachePolicyTbl[0x3d].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0x3d].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0x3d].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[0x3e].L3 = 0x10;
    pCVar2->CachePolicyTbl[0x3e].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0x3e].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0x3e].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[0x3f].L3 = 0x10;
    pCVar2->CachePolicyTbl[0x3f].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0x3f].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0x3f].HDCL1 = '\0';
    uVar3 = 0x3100000008;
  }
  else {
    if (PVar1 != IGFX_XE_HP_SDV) {
      if (PVar1 == IGFX_DG2) {
        for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
          *(undefined1 *)&pCVar2->CachePolicyTbl[lVar4].L3 = 0xb0;
          pCVar2->CachePolicyTbl[lVar4].LeCC.DwordValue =
               (pCVar2->CachePolicyTbl[lVar4].LeCC.DwordValue & 0xfff80000) + 1;
          pCVar2->CachePolicyTbl[lVar4].HDCL1 = '\0';
        }
        *(undefined1 *)&pCVar2->CachePolicyTbl[0].L3 = 0x90;
        pCVar2->CachePolicyTbl[0].LeCC.DwordValue =
             (pCVar2->CachePolicyTbl[0].LeCC.DwordValue & 0xfff80000) + 1;
        pCVar2->CachePolicyTbl[0].HDCL1 = '\0';
        *(undefined1 *)&pCVar2->CachePolicyTbl[1].L3 = 0xd0;
        pCVar2->CachePolicyTbl[1].LeCC.DwordValue =
             (pCVar2->CachePolicyTbl[1].LeCC.DwordValue & 0xfff80000) + 1;
        pCVar2->CachePolicyTbl[1].HDCL1 = '\0';
        *(undefined1 *)&pCVar2->CachePolicyTbl[2].L3 = 0x50;
        pCVar2->CachePolicyTbl[2].LeCC.DwordValue =
             (pCVar2->CachePolicyTbl[2].LeCC.DwordValue & 0xfff80000) + 1;
        pCVar2->CachePolicyTbl[2].HDCL1 = '\0';
        *(undefined1 *)&pCVar2->CachePolicyTbl[3].L3 = 0xb0;
        pCVar2->CachePolicyTbl[3].LeCC.DwordValue =
             (pCVar2->CachePolicyTbl[3].LeCC.DwordValue & 0xfff80000) + 1;
        pCVar2->CachePolicyTbl[3].HDCL1 = '\0';
        (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
        super_GmmGen9CachePolicy.CurrentMaxMocsIndex = 3;
        return;
      }
      if (PVar1 != IGFX_PVC) {
        return;
      }
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
        *(undefined1 *)&pCVar2->CachePolicyTbl[lVar4].L3 = 0x30;
        pCVar2->CachePolicyTbl[lVar4].LeCC.DwordValue =
             (pCVar2->CachePolicyTbl[lVar4].LeCC.DwordValue & 0xfff80000) + 1;
        pCVar2->CachePolicyTbl[lVar4].HDCL1 = '\0';
      }
      *(undefined1 *)&pCVar2->CachePolicyTbl[1].L3 = 0x10;
      pCVar2->CachePolicyTbl[1].LeCC.DwordValue =
           (pCVar2->CachePolicyTbl[1].LeCC.DwordValue & 0xfff80000) + 1;
      pCVar2->CachePolicyTbl[1].HDCL1 = '\0';
      *(undefined1 *)&pCVar2->CachePolicyTbl[2].L3 = 0x30;
      pCVar2->CachePolicyTbl[2].LeCC.DwordValue =
           (pCVar2->CachePolicyTbl[2].LeCC.DwordValue & 0xfff80000) + 1;
      pCVar2->CachePolicyTbl[2].HDCL1 = '\0';
      (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.CurrentMaxMocsIndex = 2;
      return;
    }
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      *(undefined1 *)&pCVar2->CachePolicyTbl[lVar4].L3 = 0xb0;
      pCVar2->CachePolicyTbl[lVar4].LeCC.DwordValue =
           (pCVar2->CachePolicyTbl[lVar4].LeCC.DwordValue & 0xfff80000) + 1;
      pCVar2->CachePolicyTbl[lVar4].HDCL1 = '\0';
    }
    *(undefined1 *)&pCVar2->CachePolicyTbl[1].L3 = 0x90;
    pCVar2->CachePolicyTbl[1].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[1].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[1].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[2].L3 = 0xd0;
    pCVar2->CachePolicyTbl[2].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[2].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[2].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[3].L3 = 0x50;
    pCVar2->CachePolicyTbl[3].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[3].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[3].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[4].L3 = 0x10;
    pCVar2->CachePolicyTbl[4].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[4].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[4].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[5].L3 = 0xb0;
    pCVar2->CachePolicyTbl[5].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[5].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[5].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[0x30].L3 = 0xb0;
    pCVar2->CachePolicyTbl[0x30].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0x30].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0x30].HDCL1 = '\x01';
    *(undefined1 *)&pCVar2->CachePolicyTbl[0x31].L3 = 0x90;
    pCVar2->CachePolicyTbl[0x31].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0x31].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0x31].HDCL1 = '\x01';
    *(undefined1 *)&pCVar2->CachePolicyTbl[0x3c].L3 = 0x10;
    pCVar2->CachePolicyTbl[0x3c].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0x3c].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0x3c].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[0x3d].L3 = 0x10;
    pCVar2->CachePolicyTbl[0x3d].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0x3d].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0x3d].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[0x3e].L3 = 0x10;
    pCVar2->CachePolicyTbl[0x3e].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0x3e].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0x3e].HDCL1 = '\0';
    *(undefined1 *)&pCVar2->CachePolicyTbl[0x3f].L3 = 0x10;
    pCVar2->CachePolicyTbl[0x3f].LeCC.DwordValue =
         (pCVar2->CachePolicyTbl[0x3f].LeCC.DwordValue & 0xfff80000) + 1;
    pCVar2->CachePolicyTbl[0x3f].HDCL1 = '\0';
    uVar3 = 0x3100000005;
  }
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
  super_GmmGen9CachePolicy.CurrentMaxMocsIndex = (int)uVar3;
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
  super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex = (int)((ulong)uVar3 >> 0x20);
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.CurrentMaxSpecialMocsIndex = 0x3f;
  return;
}

Assistant:

void GmmLib::GmmGen12dGPUCachePolicy::SetUpMOCSTable()
{
    GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement = &(pGmmLibContext->GetCachePolicyTlbElement()[0]);
    CurrentMaxL1HdcMocsIndex                             = 0;
    CurrentMaxSpecialMocsIndex                           = 0;

#define GMM_DEFINE_MOCS(Index, L3_ESC, L3_SCC, L3_CC, L3_Go, L3_LookUp, _HDCL1)        \
    {                                                                                  \
        pCachePolicyTlbElement[Index].L3.ESC            = L3_ESC;                      \
        pCachePolicyTlbElement[Index].L3.SCC            = L3_SCC;                      \
        pCachePolicyTlbElement[Index].L3.Cacheability   = L3_CC;                       \
        pCachePolicyTlbElement[Index].L3.GlobalGo       = L3_Go;                       \
        pCachePolicyTlbElement[Index].L3.UCLookup       = L3_LookUp;                   \
        pCachePolicyTlbElement[Index].LeCC.Cacheability = 1;                           \
        pCachePolicyTlbElement[Index].LeCC.TargetCache  = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.LRUM         = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.AOM          = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.ESC          = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.SCC          = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.PFM          = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.SCF          = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.CoS          = CLASS_SERVICE_ZERO;          \
        pCachePolicyTlbElement[Index].LeCC.SelfSnoop    = DISABLE_SELF_SNOOP_OVERRIDE; \
        pCachePolicyTlbElement[Index].HDCL1             = _HDCL1;                      \
    }

    // clang-format off

    if (GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_DG1)
    {
        //Default MOCS Table
        for(int index = 0; index < GMM_MAX_NUMBER_MOCS_INDEXES; index++)
        {     //             Index     ESC    SCC    L3CC    Go      LookUp    HDCL1
             GMM_DEFINE_MOCS( index  , 0     , 0     , 3     , 0     , 0       , 0 )
        }
        // Fixed MOCS Table
        //              Index     ESC	  SCC	  L3CC    Go      LookUp    HDCL1
        GMM_DEFINE_MOCS( 0      , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 1      , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 2      , 0     , 0     , 0     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 3      , 0     , 0     , 0     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 4      , 0     , 0     , 0     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 5      , 0     , 0     , 3     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 6      , 1     , 1     , 3     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 7      , 1     , 3     , 3     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 8      , 1     , 7     , 3     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 48     , 0     , 0     , 3     , 0     , 0       , 1 )
        GMM_DEFINE_MOCS( 49     , 0     , 0     , 1     , 0     , 0       , 1 )
        GMM_DEFINE_MOCS( 60     , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 61     , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 62     , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 63     , 0     , 0     , 1     , 0     , 0       , 0 )

        CurrentMaxMocsIndex         = 8;
        CurrentMaxL1HdcMocsIndex    = 49;
        CurrentMaxSpecialMocsIndex  = 63;

    }
    else if (GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_XE_HP_SDV)
     {
        //Default MOCS Table
        for(int index = 0; index < GMM_MAX_NUMBER_MOCS_INDEXES; index++)
        {     //             Index     ESC    SCC    L3CC    Go      LookUp    HDCL1
             GMM_DEFINE_MOCS( index  , 0     , 0     , 3     , 0     , 1       , 0 )
        }
        // Fixed MOCS Table
        //              Index     ESC	  SCC	  L3CC    Go      LookUp    HDCL1
        GMM_DEFINE_MOCS( 1      , 0     , 0     , 1     , 0     , 1       , 0 )
        GMM_DEFINE_MOCS( 2      , 0     , 0     , 1     , 1     , 1       , 0 )
        GMM_DEFINE_MOCS( 3      , 0     , 0     , 1     , 1     , 0       , 0 )
        GMM_DEFINE_MOCS( 4      , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 5      , 0     , 0     , 3     , 0     , 1       , 0 )
        GMM_DEFINE_MOCS( 48     , 0     , 0     , 3     , 0     , 1       , 1 )
        GMM_DEFINE_MOCS( 49     , 0     , 0     , 1     , 0     , 1       , 1 )
        GMM_DEFINE_MOCS( 60     , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 61     , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 62     , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 63     , 0     , 0     , 1     , 0     , 0       , 0 )

        CurrentMaxMocsIndex         = 5;
        CurrentMaxL1HdcMocsIndex    = 49;
        CurrentMaxSpecialMocsIndex  = 63;

    }
    else if ((GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_DG2))
     {
        //Default MOCS Table
        for(int index = 0; index < GMM_MAX_NUMBER_MOCS_INDEXES; index++)
        {     //             Index     ESC	  SCC	  L3CC    Go      LookUp    HDCL1
             GMM_DEFINE_MOCS( index  , 0     , 0     , 3     , 0     , 1       , 0 )
        }
         // Fixed MOCS Table
        //              Index     ESC	  SCC	  L3CC    Go      LookUp    HDCL1
        GMM_DEFINE_MOCS( 0      , 0     , 0     , 1     , 0     , 1       , 0 )
        GMM_DEFINE_MOCS( 1      , 0     , 0     , 1     , 1     , 1       , 0 )
        GMM_DEFINE_MOCS( 2      , 0     , 0     , 1     , 1     , 0       , 0 )
        GMM_DEFINE_MOCS( 3      , 0     , 0     , 3     , 0     , 1       , 0 )

        CurrentMaxMocsIndex         = 3;
    }
    else if (GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_PVC) 
     {
         //Default MOCS Table
        for(int index = 0; index < GMM_MAX_NUMBER_MOCS_INDEXES; index++)
        {     //             Index     ESC	  SCC	  L3CC    Go      LookUp    HDCL1
             GMM_DEFINE_MOCS( index  , 0     , 0     , 3     , 0     , 0       , 0 )
        }
         // Fixed MOCS Table
        //              Index     ESC	  SCC	  L3CC    Go      LookUp    HDCL1
        GMM_DEFINE_MOCS( 1      , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 2      , 0     , 0     , 3     , 0     , 0       , 0 )

        CurrentMaxMocsIndex         = 2;
     }
// clang-format on


#undef GMM_DEFINE_MOCS
}